

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.c
# Opt level: O0

el_action_t ed_next_history(EditLine *el,wint_t c)

{
  el_action_t local_1d;
  el_action_t rval;
  el_action_t beep;
  wint_t c_local;
  EditLine *el_local;
  
  local_1d = '\x04';
  (el->el_chared).c_undo.len = -1;
  *(el->el_line).lastchar = L'\0';
  (el->el_history).eventno = (el->el_history).eventno - (el->el_state).argument;
  if ((el->el_history).eventno < L'\0') {
    (el->el_history).eventno = L'\0';
    local_1d = '\t';
  }
  el_local._7_1_ = hist_get(el);
  if (el_local._7_1_ == '\x04') {
    el_local._7_1_ = local_1d;
  }
  return el_local._7_1_;
}

Assistant:

libedit_private el_action_t
/*ARGSUSED*/
ed_next_history(EditLine *el, wint_t c __attribute__((__unused__)))
{
	el_action_t beep = CC_REFRESH, rval;

	el->el_chared.c_undo.len = -1;
	*el->el_line.lastchar = '\0';	/* just in case */

	el->el_history.eventno -= el->el_state.argument;

	if (el->el_history.eventno < 0) {
		el->el_history.eventno = 0;
		beep = CC_REFRESH_BEEP;
	}
	rval = hist_get(el);
	if (rval == CC_REFRESH)
		return beep;
	return rval;

}